

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O3

bool __thiscall
MutableTransactionSignatureCreator::CreateSchnorrSig
          (MutableTransactionSignatureCreator *this,SigningProvider *provider,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *sig,XOnlyPubKey *pubkey,
          uint256 *leaf_hash,uint256 *merkle_root,SigVersion sigversion)

{
  PrecomputedTransactionData *cache;
  pointer puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  pointer *__ptr;
  long in_FS_OFFSET;
  Span<unsigned_char> sig_00;
  undefined1 local_108 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_100;
  uint256 local_f8;
  uint256 hash;
  ScriptExecutionData local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((sigversion & ~WITNESS_V0) != TAPROOT) {
    __assert_fail("sigversion == SigVersion::TAPROOT || sigversion == SigVersion::TAPSCRIPT",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/sign.cpp"
                  ,0x40,
                  "virtual bool MutableTransactionSignatureCreator::CreateSchnorrSig(const SigningProvider &, std::vector<unsigned char> &, const XOnlyPubKey &, const uint256 *, const uint256 *, SigVersion) const"
                 );
  }
  local_108[0] = false;
  local_100._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  bVar6 = SigningProvider::GetKeyByXOnly(provider,pubkey,(CKey *)local_108);
  if ((((bVar6) && (cache = this->m_txdata, cache != (PrecomputedTransactionData *)0x0)) &&
      (cache->m_bip341_taproot_ready == true)) && (cache->m_spent_outputs_ready == true)) {
    local_b8.m_output_hash.super__Optional_base<uint256,_true,_true>._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
    local_b8.m_tapleaf_hash_init = false;
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_b8.m_codeseparator_pos_init = false;
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_b8.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_b8.m_validation_weight_left_init = false;
    local_b8.m_annex_init = true;
    local_b8.m_annex_present = false;
    if (sigversion == TAPSCRIPT) {
      local_b8.m_codeseparator_pos_init = true;
      local_b8.m_codeseparator_pos = 0xffffffff;
      if (leaf_hash == (uint256 *)0x0) goto LAB_0018ee5b;
      local_b8.m_tapleaf_hash_init = true;
      uVar2 = *(undefined8 *)(leaf_hash->super_base_blob<256U>).m_data._M_elems;
      uVar3 = *(undefined8 *)((leaf_hash->super_base_blob<256U>).m_data._M_elems + 8);
      uVar4 = *(undefined8 *)((leaf_hash->super_base_blob<256U>).m_data._M_elems + 0x10);
      uVar5 = *(undefined8 *)((leaf_hash->super_base_blob<256U>).m_data._M_elems + 0x18);
      local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems._0_7_ = SUB87(uVar2,0);
      local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[7] =
           (uchar)((ulong)uVar2 >> 0x38);
      local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems._8_7_ = SUB87(uVar3,0);
      local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
           (uchar)((ulong)uVar3 >> 0x38);
      local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems._16_7_ = SUB87(uVar4,0);
      local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
           (uchar)((ulong)uVar4 >> 0x38);
      local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems._24_7_ = SUB87(uVar5,0);
      local_b8.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
           (uchar)((ulong)uVar5 >> 0x38);
    }
    hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    bVar6 = SignatureHashSchnorr<CMutableTransaction>
                      (&hash,&local_b8,this->m_txto,this->nIn,(uint8_t)this->nHashType,sigversion,
                       cache,FAIL);
    if (bVar6) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(sig,0x40);
      puVar1 = (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sig_00.m_size =
           (long)(sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar1;
      local_f8.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_f8.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      sig_00.m_data = puVar1;
      bVar6 = CKey::SignSchnorr((CKey *)local_108,&hash,sig_00,merkle_root,&local_f8);
      if (bVar6) {
        bVar6 = true;
        if (this->nHashType != 0) {
          local_f8.super_base_blob<256U>.m_data._M_elems[0] = (uchar)this->nHashType;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (sig,(uchar *)&local_f8);
        }
        goto LAB_0018ee5d;
      }
    }
  }
LAB_0018ee5b:
  bVar6 = false;
LAB_0018ee5d:
  if (local_100._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_100,
               local_100._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool MutableTransactionSignatureCreator::CreateSchnorrSig(const SigningProvider& provider, std::vector<unsigned char>& sig, const XOnlyPubKey& pubkey, const uint256* leaf_hash, const uint256* merkle_root, SigVersion sigversion) const
{
    assert(sigversion == SigVersion::TAPROOT || sigversion == SigVersion::TAPSCRIPT);

    CKey key;
    if (!provider.GetKeyByXOnly(pubkey, key)) return false;

    // BIP341/BIP342 signing needs lots of precomputed transaction data. While some
    // (non-SIGHASH_DEFAULT) sighash modes exist that can work with just some subset
    // of data present, for now, only support signing when everything is provided.
    if (!m_txdata || !m_txdata->m_bip341_taproot_ready || !m_txdata->m_spent_outputs_ready) return false;

    ScriptExecutionData execdata;
    execdata.m_annex_init = true;
    execdata.m_annex_present = false; // Only support annex-less signing for now.
    if (sigversion == SigVersion::TAPSCRIPT) {
        execdata.m_codeseparator_pos_init = true;
        execdata.m_codeseparator_pos = 0xFFFFFFFF; // Only support non-OP_CODESEPARATOR BIP342 signing for now.
        if (!leaf_hash) return false; // BIP342 signing needs leaf hash.
        execdata.m_tapleaf_hash_init = true;
        execdata.m_tapleaf_hash = *leaf_hash;
    }
    uint256 hash;
    if (!SignatureHashSchnorr(hash, execdata, m_txto, nIn, nHashType, sigversion, *m_txdata, MissingDataBehavior::FAIL)) return false;
    sig.resize(64);
    // Use uint256{} as aux_rnd for now.
    if (!key.SignSchnorr(hash, sig, merkle_root, {})) return false;
    if (nHashType) sig.push_back(nHashType);
    return true;
}